

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.cpp
# Opt level: O0

void InsertMacro(CMacro *Macro,wstring *Args)

{
  pointer *ppEVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  pointer pbVar8;
  long lVar9;
  size_type sVar10;
  reference ppCVar11;
  ulong local_140;
  size_t i_1;
  wstring local_130 [7];
  bool macro;
  undefined1 local_110 [32];
  pointer local_d0;
  size_t i;
  size_t MacroCounter;
  pointer local_b8;
  pointer local_b0;
  wchar_t *local_a8;
  undefined1 local_90 [8];
  ArgumentList Arguments;
  tTextData Text;
  wstring *Args_local;
  CMacro *Macro_local;
  
  Text._88_8_ = Args;
  tTextData::tTextData
            (&Arguments.entries.
              super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ArgumentList::ArgumentList((ArgumentList *)local_90);
  splitArguments((ArgumentList *)local_90,(wstring *)Text._88_8_);
  sVar6 = ArgumentList::size((ArgumentList *)local_90);
  sVar7 = CMacro::getArgumentCount(Macro);
  if ((long)(int)sVar6 == sVar7) {
    Global.MacroNestingLevel = Global.MacroNestingLevel + 1;
    if (Global.MacroNestingLevel == 0x80) {
      Logger::printError<>(Error,L"Maximum macro nesting level reached");
      MacroCounter._4_4_ = 1;
    }
    else {
      i = CMacro::getIncreaseCounter(Macro);
      for (local_d0 = (pointer)0x0; pbVar2 = local_d0, pbVar8 = (pointer)CMacro::getLineCount(Macro)
          , pbVar2 < pbVar8; local_d0 = local_d0 + 1) {
        CMacro::getLine_abi_cxx11_
                  ((CMacro *)&stack0xffffffffffffff10,(size_t)Macro,(ArgumentList *)local_d0,
                   (size_t)local_90);
        ppEVar1 = &Arguments.entries.
                   super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::wstring::operator=((wstring *)ppEVar1,(wstring *)&stack0xffffffffffffff10);
        std::__cxx11::wstring::~wstring((wstring *)&stack0xffffffffffffff10);
        SymbolTable::insertEquations
                  ((SymbolTable *)local_110,(wstring *)&Global.symbolTable,(uint)ppEVar1,
                   Global.FileInfo.FileNum);
        ppEVar1 = &Arguments.entries.
                   super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::wstring::operator=((wstring *)ppEVar1,(wstring *)local_110);
        std::__cxx11::wstring::~wstring((wstring *)local_110);
        bVar3 = CheckEquLabel((wstring *)ppEVar1);
        if (!bVar3) {
          checkLabel(local_130,
                     SUB81(&Arguments.entries.
                            super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0));
          ppEVar1 = &Arguments.entries.
                     super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::wstring::operator=((wstring *)ppEVar1,(wstring *)local_130);
          std::__cxx11::wstring::~wstring((wstring *)local_130);
          splitLine((wstring *)ppEVar1,(wstring *)&Text.field_0x18,(wstring *)&Text.field_0x38);
          lVar9 = std::__cxx11::wstring::size();
          if (lVar9 != 0) {
            bVar3 = false;
            for (local_140 = 0;
                sVar10 = std::vector<CMacro_*,_std::allocator<CMacro_*>_>::size(&Global.Macros),
                local_140 < sVar10; local_140 = local_140 + 1) {
              ppCVar11 = std::vector<CMacro_*,_std::allocator<CMacro_*>_>::operator[]
                                   (&Global.Macros,local_140);
              CMacro::getName_abi_cxx11_(*ppCVar11);
              iVar4 = std::__cxx11::wstring::compare((wstring *)&Text.field_0x18);
              if (iVar4 == 0) {
                ppCVar11 = std::vector<CMacro_*,_std::allocator<CMacro_*>_>::operator[]
                                     (&Global.Macros,local_140);
                InsertMacro(*ppCVar11,(wstring *)&Text.field_0x38);
                bVar3 = true;
              }
            }
            if ((!bVar3) &&
               (uVar5 = (*Arch->_vptr_CArchitecture[1])(Arch,&Text.field_0x18,&Text.field_0x38),
               (uVar5 & 1) == 0)) {
              (**Arch->_vptr_CArchitecture)(Arch,&Text.field_0x18,&Text.field_0x38);
            }
          }
        }
      }
      Global.MacroNestingLevel = Global.MacroNestingLevel + -1;
      MacroCounter._4_4_ = 0;
    }
  }
  else {
    sVar6 = ArgumentList::size((ArgumentList *)local_90);
    sVar7 = CMacro::getArgumentCount(Macro);
    local_a8 = L"Not enough";
    if (sVar7 < (ulong)(long)(int)sVar6) {
      local_a8 = L"Too many";
    }
    local_b0 = (pointer)ArgumentList::size((ArgumentList *)local_90);
    local_b8 = (pointer)CMacro::getArgumentCount(Macro);
    Logger::printError<wchar_t_const*,unsigned_long,unsigned_long>
              (Error,L"%s macro arguments (%d vs %d)",&stack0xffffffffffffff58,
               (unsigned_long *)&stack0xffffffffffffff50,(unsigned_long *)&stack0xffffffffffffff48);
    MacroCounter._4_4_ = 1;
  }
  ArgumentList::~ArgumentList((ArgumentList *)local_90);
  tTextData::~tTextData
            (&Arguments.entries.
              super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void InsertMacro(CMacro* Macro, std::wstring& Args)
{
	tTextData Text;
	ArgumentList Arguments;

	splitArguments(Arguments,Args);

	if ((int)Arguments.size() != Macro->getArgumentCount())
	{
		Logger::printError(Logger::Error,L"%s macro arguments (%d vs %d)",
			(int)Arguments.size() > Macro->getArgumentCount() ? L"Too many" : L"Not enough",
			Arguments.size(),Macro->getArgumentCount());
		return;
	}

	Global.MacroNestingLevel++;
	if (Global.MacroNestingLevel == ASSEMBLER_MACRO_NESTING_LEVEL)
	{
		Logger::printError(Logger::Error,L"Maximum macro nesting level reached");
		return;
	}

	size_t MacroCounter = Macro->getIncreaseCounter();

	for (size_t i = 0; i < Macro->getLineCount(); i++)
	{
		Text.buffer = Macro->getLine(i,Arguments,MacroCounter);
		Text.buffer = Global.symbolTable.insertEquations(Text.buffer,Global.FileInfo.FileNum,Global.Section);

		if (CheckEquLabel(Text.buffer) == false)
		{
			Text.buffer = checkLabel(Text.buffer,false);
			splitLine(Text.buffer,Text.name,Text.params);
			if (Text.name.size() == 0) continue;

			bool macro = false;
			for (size_t i = 0; i < Global.Macros.size(); i++)
			{
				if (Text.name.compare(Global.Macros[i]->getName()) == 0)
				{
					InsertMacro(Global.Macros[i],Text.params);
					macro = true;
				}
			}
			if (macro == true) continue;

			if (Arch->AssembleDirective(Text.name,Text.params) == false)
			{
				Arch->AssembleOpcode(Text.name,Text.params);
			}
		}
	}
	Global.MacroNestingLevel--;
}